

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR moveto_scnode_dfs(lyxp_set *set,lysc_node *start,uint32_t start_idx,lys_module *moveto_mod,
                        char *ncname,uint32_t options)

{
  uint8_t *puVar1;
  ly_bool lVar2;
  LY_ERR LVar3;
  LY_ERR ret__;
  LY_ERR rc;
  uint32_t idx;
  lysc_node *elem;
  lysc_node *next;
  char *pcStack_38;
  uint32_t options_local;
  char *ncname_local;
  lys_module *moveto_mod_local;
  lysc_node *plStack_20;
  uint32_t start_idx_local;
  lysc_node *start_local;
  lyxp_set *set_local;
  
  elem = start;
  next._4_4_ = options;
  pcStack_38 = ncname;
  ncname_local = (char *)moveto_mod;
  moveto_mod_local._4_4_ = start_idx;
  plStack_20 = start;
  start_local = (lysc_node *)set;
  do {
    if (elem == (lysc_node *)0x0) {
      return LY_SUCCESS;
    }
    _rc = elem;
    if ((elem == plStack_20) || ((elem->nodetype & 0x82) != 0)) {
LAB_00222b6d:
      elem = lysc_node_child(_rc);
      if (((elem == (lysc_node *)0x0) || (elem->nodetype != 0x1000)) || ((next._4_4_ & 0x10) == 0))
      {
        if (((elem != (lysc_node *)0x0) && (elem->nodetype == 0x2000)) && ((next._4_4_ & 0x10) == 0)
           ) {
          elem = elem->next;
        }
      }
      else {
        elem = elem->next;
      }
      if (elem == (lysc_node *)0x0) goto LAB_00222bdf;
    }
    else {
      LVar3 = moveto_scnode_check(elem,plStack_20,(lyxp_set *)start_local,pcStack_38,
                                  (lys_module *)ncname_local);
      if (LVar3 == LY_SUCCESS) {
        lVar2 = lyxp_set_scnode_contains
                          ((lyxp_set *)start_local,_rc,LYXP_NODE_ELEM,moveto_mod_local._4_4_,&ret__)
        ;
        if (lVar2 == '\0') {
          LVar3 = lyxp_set_scnode_insert_node
                            ((lyxp_set *)start_local,_rc,LYXP_NODE_ELEM,LYXP_AXIS_DESCENDANT,
                             (uint32_t *)0x0);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
        }
        else {
          puVar1 = start_local->parent->hash + (ulong)ret__ * 0x18 + 8;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          if (moveto_mod_local._4_4_ < ret__) goto LAB_00222bdf;
        }
        goto LAB_00222b6d;
      }
      if (LVar3 != LY_EINVAL) goto LAB_00222b6d;
LAB_00222bdf:
      if (_rc == plStack_20) {
        return LY_SUCCESS;
      }
      elem = _rc->next;
    }
    while ((elem == (lysc_node *)0x0 && (_rc->parent != plStack_20))) {
      _rc = _rc->parent;
      elem = _rc->next;
    }
  } while( true );
}

Assistant:

static LY_ERR
moveto_scnode_dfs(struct lyxp_set *set, const struct lysc_node *start, uint32_t start_idx,
        const struct lys_module *moveto_mod, const char *ncname, uint32_t options)
{
    const struct lysc_node *next, *elem;
    uint32_t idx;
    LY_ERR rc;

    /* TREE DFS */
    for (elem = next = start; elem; elem = next) {
        if ((elem == start) || (elem->nodetype & (LYS_CHOICE | LYS_CASE))) {
            /* schema-only nodes, skip root */
            goto next_iter;
        }

        rc = moveto_scnode_check(elem, start, set, ncname, moveto_mod);
        if (!rc) {
            if (lyxp_set_scnode_contains(set, elem, LYXP_NODE_ELEM, start_idx, &idx)) {
                set->val.scnodes[idx].in_ctx = LYXP_SET_SCNODE_ATOM_CTX;
                if (idx > start_idx) {
                    /* we will process it later in the set */
                    goto skip_children;
                }
            } else {
                LY_CHECK_RET(lyxp_set_scnode_insert_node(set, elem, LYXP_NODE_ELEM, LYXP_AXIS_DESCENDANT, NULL));
            }
        } else if (rc == LY_EINVAL) {
            goto skip_children;
        }

next_iter:
        /* TREE DFS NEXT ELEM */
        /* select element for the next run - children first */
        next = lysc_node_child(elem);
        if (next && (next->nodetype == LYS_INPUT) && (options & LYXP_SCNODE_OUTPUT)) {
            next = next->next;
        } else if (next && (next->nodetype == LYS_OUTPUT) && !(options & LYXP_SCNODE_OUTPUT)) {
            next = next->next;
        }
        if (!next) {
skip_children:
            /* no children, so try siblings, but only if it's not the start,
             * that is considered to be the root and it's siblings are not traversed */
            if (elem != start) {
                next = elem->next;
            } else {
                break;
            }
        }
        while (!next) {
            /* no siblings, go back through the parents */
            if (elem->parent == start) {
                /* we are done, no next element to process */
                break;
            }
            /* parent is already processed, go to its sibling */
            elem = elem->parent;
            next = elem->next;
        }
    }

    return LY_SUCCESS;
}